

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O0

void __thiscall wallet::WalletDescriptor::DeserializeDescriptor(WalletDescriptor *this,string *str)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  char *pcVar4;
  __shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  string *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  FlatSigningProvider keys;
  string error;
  FlatSigningProvider *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  io_errc in_stack_fffffffffffffe14;
  error_code *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe5c;
  FlatSigningProvider *in_stack_fffffffffffffe60;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = &local_28;
  std::__cxx11::string::string(in_stack_fffffffffffffe20);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffe08);
  Parse(in_RSI,in_stack_fffffffffffffe60,
        (string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
        SUB81((ulong)__rhs >> 0x38,0));
  bVar1 = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   *)in_stack_fffffffffffffe18);
  if (bVar1) {
    uVar6 = CONCAT13(1,(int3)in_stack_fffffffffffffe58);
    psVar2 = (string *)__cxa_allocate_exception(0x20);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffe5c,uVar6),__rhs);
    std::ios_base::failure[abi:cxx11]::failure(psVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(psVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    sVar3 = std::
            vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    *)in_stack_fffffffffffffe08);
    if (sVar3 < 2) {
      this_00 = (__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::
                vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                      *)in_stack_fffffffffffffe18,
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      std::shared_ptr<Descriptor>::operator=
                ((shared_ptr<Descriptor> *)this_00,
                 (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (this_00);
      DescriptorID((Descriptor *)__rhs);
      *(undefined8 *)(in_RDI + 0x20) = local_150;
      *(undefined8 *)(in_RDI + 0x28) = uStack_148;
      *(undefined8 *)(in_RDI + 0x10) = local_160;
      *(undefined8 *)(in_RDI + 0x18) = uStack_158;
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 *)this_00);
      FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffe08);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
    }
    else {
      pcVar4 = (char *)__cxa_allocate_exception(0x20);
      pcVar5 = pcVar4;
      std::error_code::error_code<std::io_errc,void>
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar4,(error_code *)"Can\'t load a multipath descriptor from databases");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeDescriptor(const std::string& str)
    {
        std::string error;
        FlatSigningProvider keys;
        auto descs = Parse(str, keys, error, true);
        if (descs.empty()) {
            throw std::ios_base::failure("Invalid descriptor: " + error);
        }
        if (descs.size() > 1) {
            throw std::ios_base::failure("Can't load a multipath descriptor from databases");
        }
        descriptor = std::move(descs.at(0));
        id = DescriptorID(*descriptor);
    }